

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

int Gia_ManEncodeFanin(Gia_Man_t *p,int iLit)

{
  Gia_Obj_t *pObj;
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  uVar6 = (uint)iLit >> 1;
  if ((int)uVar6 < p->nObjs) {
    uVar1 = *(ulong *)(p->pObjs + uVar6);
    iVar2 = 7;
    if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
      uVar4 = (uint)uVar1;
      uVar5 = (uint)(uVar1 >> 0x20);
      if ((~uVar4 & 0x9fffffff) == 0) {
        iVar2 = (p->vCis->nSize - p->nRegs <= (int)(uVar5 & 0x1fffffff)) + 9;
      }
      else if (((~uVar4 & 0x1fffffff) == 0 || (int)uVar4 < 0) ||
              (iVar2 = 0xb, (uVar5 & 0x1fffffff) <= (uVar4 & 0x1fffffff))) {
        pObj = p->pObjs + uVar6;
        iVar3 = Gia_ObjIsMux(p,pObj);
        iVar2 = 0xc;
        if ((iVar3 == 0) &&
           ((uVar6 = (uint)*(undefined8 *)pObj, (int)uVar6 < 0 ||
            (iVar2 = 0xd, (uVar6 & 0x1fffffff) == 0x1fffffff)))) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMuxes.c"
                        ,0x2af,"int Gia_ManEncodeFanin(Gia_Man_t *, int)");
        }
      }
    }
    return iVar2;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEncodeFanin( Gia_Man_t * p, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    if ( Gia_ObjIsConst0(pObj) )
        return iC0;
    if ( Gia_ObjIsPi(p, pObj) )
        return iPI;
    if ( Gia_ObjIsCi(pObj) )
        return iFF;
    if ( Gia_ObjIsXor(pObj) )
        return iXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return iMUX;
    assert( Gia_ObjIsAnd(pObj) );
    return iAND;
//    if ( Abc_LitIsCompl(iLit) )
//        return iANDn;
//    else
//        return iANDp;
}